

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packages.cpp
# Opt level: O0

bool IsConsistentPackage(Package *txns)

{
  bool bVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  long in_FS_OFFSET;
  insert_iterator<std::unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>_>
  iVar4;
  CTxIn *input;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range2;
  shared_ptr<const_CTransaction> *tx;
  Package *__range1;
  const_iterator __end2;
  const_iterator __begin2;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
  inputs_seen;
  key_type *in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  _Node_iterator_base<COutPoint,_false> in_stack_fffffffffffffec8;
  _Node_iterator_base<COutPoint,_false> __i;
  bool local_81;
  undefined1 local_50 [72];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
  ::unordered_set((unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
                   *)in_stack_fffffffffffffeb8);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::begin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::end((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
  do {
    bVar1 = __gnu_cxx::
            operator==<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                      ((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                        *)in_stack_fffffffffffffec8._M_cur,
                       (__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_81 = true;
LAB_01244fc0:
      std::
      unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
      ::~unordered_set((unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
                        *)in_stack_fffffffffffffeb8);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return local_81;
      }
      __stack_chk_fail();
    }
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
    ::operator*((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                 *)in_stack_fffffffffffffeb8);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffffeb8);
    bVar1 = std::vector<CTxIn,_std::allocator<CTxIn>_>::empty
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffec8._M_cur);
    if (bVar1) {
      local_81 = false;
      goto LAB_01244fc0;
    }
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffffeb8);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::begin
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)
               CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
    std::vector<CTxIn,_std::allocator<CTxIn>_>::end
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)
               CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
    while( true ) {
      bVar1 = __gnu_cxx::operator==<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                        ((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                          *)in_stack_fffffffffffffec8._M_cur,
                         (__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                          *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
      operator*((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                in_stack_fffffffffffffeb8);
      std::
      unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
      ::find((unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
              *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
             in_stack_fffffffffffffeb8);
      std::
      unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
      ::end((unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
             *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
      bVar1 = std::__detail::operator==
                        ((_Node_iterator_base<COutPoint,_false> *)in_stack_fffffffffffffec8._M_cur,
                         (_Node_iterator_base<COutPoint,_false> *)
                         CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        local_81 = false;
        goto LAB_01244fc0;
      }
      __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
      operator++((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                 in_stack_fffffffffffffeb8);
    }
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffffeb8);
    cVar2 = std::vector<CTxIn,_std::allocator<CTxIn>_>::cbegin
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                       CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffffeb8);
    cVar3 = std::vector<CTxIn,_std::allocator<CTxIn>_>::cend
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                       CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
    __i._M_cur = (__node_type *)local_50;
    std::
    unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
    ::end((unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
           *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
    iVar4 = std::
            inserter<std::unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>_>
                      ((unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
                        *)in_stack_fffffffffffffec8._M_cur,
                       (__range_iter_t<std::unordered_set<COutPoint,_SaltedOutpointHasher>_>)
                       __i._M_cur);
    iVar4 = std::
            transform<__gnu_cxx::__normal_iterator<CTxIn_const*,std::vector<CTxIn,std::allocator<CTxIn>>>,std::insert_iterator<std::unordered_set<COutPoint,SaltedOutpointHasher,std::equal_to<COutPoint>,std::allocator<COutPoint>>>,IsConsistentPackage(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::__0>
                      (cVar2._M_current,cVar3._M_current,iVar4.container,
                       iVar4.iter.super__Node_iterator_base<COutPoint,_false>._M_cur.
                       super__Node_iterator_base<COutPoint,_false>);
    in_stack_fffffffffffffec8._M_cur =
         (__node_type *)iVar4.iter.super__Node_iterator_base<COutPoint,_false>._M_cur;
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
    ::operator++((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                  *)in_stack_fffffffffffffeb8);
  } while( true );
}

Assistant:

bool IsConsistentPackage(const Package& txns)
{
    // Don't allow any conflicting transactions, i.e. spending the same inputs, in a package.
    std::unordered_set<COutPoint, SaltedOutpointHasher> inputs_seen;
    for (const auto& tx : txns) {
        if (tx->vin.empty()) {
            // This function checks consistency based on inputs, and we can't do that if there are
            // no inputs. Duplicate empty transactions are also not consistent with one another.
            // This doesn't create false negatives, as unconfirmed transactions are not allowed to
            // have no inputs.
            return false;
        }
        for (const auto& input : tx->vin) {
            if (inputs_seen.find(input.prevout) != inputs_seen.end()) {
                // This input is also present in another tx in the package.
                return false;
            }
        }
        // Batch-add all the inputs for a tx at a time. If we added them 1 at a time, we could
        // catch duplicate inputs within a single tx.  This is a more severe, consensus error,
        // and we want to report that from CheckTransaction instead.
        std::transform(tx->vin.cbegin(), tx->vin.cend(), std::inserter(inputs_seen, inputs_seen.end()),
                       [](const auto& input) { return input.prevout; });
    }
    return true;
}